

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesmsg.h
# Opt level: O0

void __thiscall TrodesMsg::popcontents<unsigned_long>(TrodesMsg *this,string *f,unsigned_long *head)

{
  ulong uVar1;
  string *this_00;
  uint64_t *in_RSI;
  TrodesMsg *in_RDI;
  string e;
  TrodesMsg *in_stack_ffffffffffffff90;
  string local_50;
  undefined1 local_2d;
  allocator local_19 [25];
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator[]((ulong)in_RSI);
    processArg(in_stack_ffffffffffffff90,(char)((ulong)in_RDI >> 0x38),in_RSI);
    std::__cxx11::string::erase((ulong)in_RDI,0);
    std::__cxx11::string::substr((ulong)&local_50,(ulong)in_RSI);
    popcontents(in_RDI,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    return;
  }
  local_2d = 1;
  this_00 = (string *)__cxa_allocate_exception(0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (this_00,"TrodesMsg Error: Mismatched format string and variables",local_19);
  local_2d = 0;
  __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void popcontents(std::string f, H &head, T & ... tail){
        try{
            if(f.empty())
                throw std::string("TrodesMsg Error: Mismatched format string and variables");
            processArg(f[0], head);
            format.erase(0, 1);
            popcontents(f.substr(1), tail...);
        } catch(std::string e){
            std::cout << "[TrodesMsg::popcontents Error] " << e << "\n";
        } catch(...){
            std::cout << "[TrodesMsg::popcontents Error] Unknown exception thrown!\n";
        }
    }